

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

Subscriber __thiscall miniros::NodeHandle::subscribe(NodeHandle *this,SubscribeOptions *ops)

{
  pointer pbVar1;
  bool bVar2;
  CallbackQueue *pCVar3;
  SubscribeOptions *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  pthread_mutex_t *__mutex;
  Subscriber SVar5;
  _Alloc_hider local_48;
  
  resolveName((string *)&stack0xffffffffffffffb8,(NodeHandle *)ops,&in_RDX->topic,true);
  std::__cxx11::string::operator=((string *)in_RDX,(string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  if (in_RDX->callback_queue == (CallbackQueueInterface *)0x0) {
    pCVar3 = (CallbackQueue *)
             (ops->transport_hints).transports_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pCVar3 == (CallbackQueue *)0x0) {
      pCVar3 = getGlobalCallbackQueue();
    }
    in_RDX->callback_queue = &pCVar3->super_CallbackQueueInterface;
  }
  getTopicManager((NodeHandle *)&stack0xffffffffffffffb8);
  bVar2 = TopicManager::subscribe((TopicManager *)local_48._M_p,in_RDX);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
  if (bVar2) {
    Subscriber::Subscriber((Subscriber *)this,&in_RDX->topic,(NodeHandle *)ops,&in_RDX->helper);
    __mutex = (pthread_mutex_t *)
              ((ops->transport_hints).transports_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
    std::mutex::lock((mutex *)&__mutex->__data);
    pbVar1 = (ops->transport_hints).transports_.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__weak_ptr<miniros::Subscriber::Impl,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<miniros::Subscriber::Impl,void>
              ((__weak_ptr<miniros::Subscriber::Impl,(__gnu_cxx::_Lock_policy)2> *)
               &stack0xffffffffffffffb8,
               (__shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::
    vector<std::weak_ptr<miniros::Subscriber::Impl>,std::allocator<std::weak_ptr<miniros::Subscriber::Impl>>>
    ::emplace_back<std::weak_ptr<miniros::Subscriber::Impl>>
              ((vector<std::weak_ptr<miniros::Subscriber::Impl>,std::allocator<std::weak_ptr<miniros::Subscriber::Impl>>>
                *)pbVar1[1].field_2._M_local_buf,
               (weak_ptr<miniros::Subscriber::Impl> *)&stack0xffffffffffffffb8);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
    pthread_mutex_unlock(__mutex);
    _Var4._M_pi = extraout_RDX_00;
  }
  else {
    (this->namespace_)._M_dataplus._M_p = (pointer)0x0;
    (this->namespace_)._M_string_length = 0;
    _Var4._M_pi = extraout_RDX;
  }
  SVar5.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  SVar5.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Subscriber)
         SVar5.impl_.super___shared_ptr<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Subscriber NodeHandle::subscribe(SubscribeOptions& ops)
{
  ops.topic = resolveName(ops.topic);
  if (ops.callback_queue == 0)
  {
    if (callback_queue_)
    {
      ops.callback_queue = callback_queue_;
    }
    else
    {
      ops.callback_queue = getGlobalCallbackQueue();
    }
  }

  if (getTopicManager()->subscribe(ops))
  {
    Subscriber sub(ops.topic, *this, ops.helper);

    {
      std::scoped_lock<std::mutex> lock(collection_->mutex_);
      collection_->subs_.push_back(sub.impl_);
    }

    return sub;
  }

  return Subscriber();
}